

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::anon_unknown_3::verifyMultisampleLineGroupRasterization
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               ClipMode clipMode)

{
  pointer pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  Vec4 *pVVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  pointer pSVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  float fVar23;
  undefined8 uVar24;
  float fVar25;
  float fVar26;
  float fVar30;
  float fVar31;
  undefined1 auVar27 [16];
  float fVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  float fVar35;
  undefined1 auVar34 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  TriangleSceneSpec triangleScene;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_78;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  local_48._0_4_ = surface->m_width;
  local_48._4_4_ = surface->m_height;
  uStack_40 = 0;
  local_38 = ZEXT416((uint)scene->lineWidth);
  local_78.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_78,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  pSVar12 = (scene->lines).
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->lines).
                              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12) >> 6)) {
    fVar16 = (float)(int)local_48;
    fVar17 = (float)local_48._4_4_;
    fVar18 = (float)(int)uStack_40;
    fVar19 = (float)uStack_40._4_4_;
    fVar43 = (float)local_38._0_4_ * 0.5;
    lVar9 = 0;
    do {
      auVar42._8_8_ = *(undefined8 *)pSVar12[lVar9].positions[1].m_data;
      auVar42._0_8_ = *(undefined8 *)pSVar12[lVar9].positions[0].m_data;
      fVar21 = *(float *)((long)(pSVar12[lVar9].positions + 1) + 0xc);
      fVar23 = *(float *)((long)pSVar12[lVar9].positions[0].m_data + 0xc);
      auVar33._4_4_ = fVar23;
      auVar33._0_4_ = fVar23;
      auVar33._8_4_ = fVar21;
      auVar33._12_4_ = fVar21;
      auVar27 = divps(auVar42,auVar33);
      _local_58 = auVar27;
      if (clipMode == CLIPMODE_USE_CLIPPING_BOX) {
        uVar10 = 0;
        do {
          fVar20 = (float)(int)(1 - (uVar10 & 0xfffffffe));
          uVar14 = (ulong)(uVar10 & 1);
          fVar21 = *(float *)(local_58 + uVar14 * 4);
          fVar23 = *(float *)(local_58 + uVar14 * 4 + 8);
          fVar21 = (float)(~-(uint)(fVar21 == fVar23) &
                           (uint)((fVar20 - fVar21) / (fVar23 - fVar21)) |
                          -(uint)(fVar21 == fVar23) & 0xbf800000);
          if ((0.0 < fVar21) && (fVar21 < 1.0)) {
            uVar15 = (ulong)((uVar10 & 1 ^ 1) << 2);
            fVar25 = *(float *)(local_58 + uVar15);
            fVar26 = *(float *)(local_58 + uVar15 + 8);
            uVar6 = 1 - (uVar10 >> 1);
            if (fVar23 <= fVar20) {
              uVar6 = uVar10 >> 1;
            }
            *(float *)(local_58 + uVar14 * 4 + (ulong)uVar6 * 8) = fVar20;
            *(float *)(local_58 + uVar15 + (ulong)uVar6 * 8) =
                 fVar26 * fVar21 + (1.0 - fVar21) * fVar25;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 4);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_58;
        uVar22 = uStack_50;
        uVar24 = 0;
      }
      else {
        uVar22 = auVar27._8_8_;
        uVar24 = uVar22;
      }
      lVar13 = (lVar9 << 0x21) >> 0x20;
      fVar26 = (auVar27._0_4_ + 1.0) * 0.5 * fVar16;
      fVar30 = (auVar27._4_4_ + 1.0) * 0.5 * fVar17;
      fVar31 = (auVar27._8_4_ + 0.0) * 0.0 * fVar18;
      fVar32 = (auVar27._12_4_ + 0.0) * 0.0 * fVar19;
      fVar21 = ((float)uVar22 + 1.0) * 0.5 * fVar16;
      fVar23 = ((float)((ulong)uVar22 >> 0x20) + 1.0) * 0.5 * fVar17;
      fVar20 = ((float)uVar24 + 0.0) * 0.0 * fVar18;
      fVar25 = ((float)((ulong)uVar24 >> 0x20) + 0.0) * 0.0 * fVar19;
      fVar36 = fVar21 - fVar26;
      fVar38 = fVar23 - fVar30;
      fVar40 = 1.0 / SQRT(fVar38 * fVar38 + fVar36 * fVar36 + 0.0);
      fVar36 = -fVar40 * fVar36 * fVar43;
      fVar38 = fVar40 * fVar38 * fVar43;
      fVar40 = (fVar20 - fVar31) * -0.0 * fVar43;
      fVar35 = (fVar25 - fVar32) * 0.0 * fVar43;
      auVar41._0_4_ = fVar30 + fVar36;
      auVar41._4_4_ = fVar26 + fVar38;
      auVar41._8_4_ = fVar31 + fVar40;
      auVar41._12_4_ = fVar32 + fVar35;
      auVar5._4_4_ = fVar16;
      auVar5._0_4_ = fVar17;
      auVar5._8_4_ = fVar18;
      auVar5._12_4_ = fVar19;
      auVar42 = divps(auVar41,auVar5);
      fVar37 = auVar42._4_4_ + auVar42._4_4_ + -1.0;
      fVar39 = auVar42._0_4_ + auVar42._0_4_ + -1.0;
      pSVar1 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar13;
      pSVar1->positions[0].m_data[0] = fVar37;
      pSVar1->positions[0].m_data[1] = fVar39;
      pSVar1->positions[0].m_data[2] = 0.0;
      pSVar1->positions[0].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[0] = false;
      auVar28._0_4_ = fVar26 - fVar38;
      auVar28._4_4_ = fVar30 - fVar36;
      auVar28._8_4_ = fVar31 - fVar40;
      auVar28._12_4_ = fVar32 - fVar35;
      auVar2._4_4_ = fVar17;
      auVar2._0_4_ = fVar16;
      auVar2._8_4_ = fVar18;
      auVar2._12_4_ = fVar19;
      auVar42 = divps(auVar28,auVar2);
      pVVar7 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar13].positions;
      *(ulong *)pVVar7[1].m_data =
           CONCAT44(auVar42._4_4_ + auVar42._4_4_ + -1.0,auVar42._0_4_ + auVar42._0_4_ + -1.0);
      pVVar7[1].m_data[2] = 0.0;
      pVVar7[1].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[1] = false;
      auVar29._0_4_ = fVar21 - fVar38;
      auVar29._4_4_ = fVar23 - fVar36;
      auVar29._8_4_ = fVar20 - fVar40;
      auVar29._12_4_ = fVar25 - fVar35;
      auVar3._4_4_ = fVar17;
      auVar3._0_4_ = fVar16;
      auVar3._8_4_ = fVar18;
      auVar3._12_4_ = fVar19;
      auVar42 = divps(auVar29,auVar3);
      uVar22 = CONCAT44(auVar42._4_4_ + auVar42._4_4_ + -1.0,auVar42._0_4_ + auVar42._0_4_ + -1.0);
      pVVar7 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar13].positions;
      *(undefined8 *)pVVar7[2].m_data = uVar22;
      pVVar7[2].m_data[2] = 0.0;
      pVVar7[2].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar13].sharedEdge[2] = true;
      iVar11 = (int)lVar9 * 2 + 1;
      pSVar1 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar11;
      pSVar1->positions[0].m_data[0] = fVar37;
      pSVar1->positions[0].m_data[1] = fVar39;
      pSVar1->positions[0].m_data[2] = 0.0;
      pSVar1->positions[0].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[0] = true;
      pVVar7 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar11].positions;
      *(undefined8 *)pVVar7[1].m_data = uVar22;
      pVVar7[1].m_data[2] = 0.0;
      pVVar7[1].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[1] = false;
      auVar34._0_4_ = fVar38 + fVar21;
      auVar34._4_4_ = fVar36 + fVar23;
      auVar34._8_4_ = fVar40 + fVar20;
      auVar34._12_4_ = fVar35 + fVar25;
      auVar4._4_4_ = fVar17;
      auVar4._0_4_ = fVar16;
      auVar4._8_4_ = fVar18;
      auVar4._12_4_ = fVar19;
      auVar42 = divps(auVar34,auVar4);
      pVVar7 = local_78.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar11].positions;
      *(ulong *)pVVar7[2].m_data =
           CONCAT44(auVar42._4_4_ + auVar42._4_4_ + -1.0,auVar42._0_4_ + auVar42._0_4_ + -1.0);
      pVVar7[2].m_data[2] = 0.0;
      pVVar7[2].m_data[3] = 1.0;
      local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar11].sharedEdge[2] = false;
      lVar9 = lVar9 + 1;
      pSVar12 = (scene->lines).
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(scene->lines).
                                         super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar12)
                          >> 6));
  }
  bVar8 = verifyTriangleGroupRasterization
                    (surface,(TriangleSceneSpec *)&local_78,args,log,VERIFICATIONMODE_STRICT);
  if (local_78.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool verifyMultisampleLineGroupRasterization (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, ClipMode clipMode)
{
	// Multisampled line == 2 triangles

	const tcu::Vec2		viewportSize	= tcu::Vec2((float)surface.getWidth(), (float)surface.getHeight());
	const float			halfLineWidth	= scene.lineWidth * 0.5f;
	TriangleSceneSpec	triangleScene;

	triangleScene.triangles.resize(2 * scene.lines.size());
	for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
	{
		// Transform to screen space, add pixel offsets, convert back to normalized device space, and test as triangles
		tcu::Vec2 lineNormalizedDeviceSpace[2] =
		{
			tcu::Vec2(scene.lines[lineNdx].positions[0].x() / scene.lines[lineNdx].positions[0].w(), scene.lines[lineNdx].positions[0].y() / scene.lines[lineNdx].positions[0].w()),
			tcu::Vec2(scene.lines[lineNdx].positions[1].x() / scene.lines[lineNdx].positions[1].w(), scene.lines[lineNdx].positions[1].y() / scene.lines[lineNdx].positions[1].w()),
		};

		if (clipMode == CLIPMODE_USE_CLIPPING_BOX)
		{
			applyClippingBox(lineNormalizedDeviceSpace, 1.0f);
		}

		const tcu::Vec2 lineScreenSpace[2] =
		{
			(lineNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
			(lineNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * viewportSize,
		};

		const tcu::Vec2 lineDir			= tcu::normalize(lineScreenSpace[1] - lineScreenSpace[0]);
		const tcu::Vec2 lineNormalDir	= tcu::Vec2(lineDir.y(), -lineDir.x());

		const tcu::Vec2 lineQuadScreenSpace[4] =
		{
			lineScreenSpace[0] + lineNormalDir * halfLineWidth,
			lineScreenSpace[0] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] - lineNormalDir * halfLineWidth,
			lineScreenSpace[1] + lineNormalDir * halfLineWidth,
		};
		const tcu::Vec2 lineQuadNormalizedDeviceSpace[4] =
		{
			lineQuadScreenSpace[0] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[1] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[2] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
			lineQuadScreenSpace[3] / viewportSize * 2.0f - tcu::Vec2(1.0f, 1.0f),
		};

		triangleScene.triangles[lineNdx*2 + 0].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[0] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[1].x(), lineQuadNormalizedDeviceSpace[1].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 0].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 0].sharedEdge[2] = true;

		triangleScene.triangles[lineNdx*2 + 1].positions[0] = tcu::Vec4(lineQuadNormalizedDeviceSpace[0].x(), lineQuadNormalizedDeviceSpace[0].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[0] = true;
		triangleScene.triangles[lineNdx*2 + 1].positions[1] = tcu::Vec4(lineQuadNormalizedDeviceSpace[2].x(), lineQuadNormalizedDeviceSpace[2].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[1] = false;
		triangleScene.triangles[lineNdx*2 + 1].positions[2] = tcu::Vec4(lineQuadNormalizedDeviceSpace[3].x(), lineQuadNormalizedDeviceSpace[3].y(), 0.0f, 1.0f);	triangleScene.triangles[lineNdx*2 + 1].sharedEdge[2] = false;
	}

	return verifyTriangleGroupRasterization(surface, triangleScene, args, log);
}